

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

double matd_vec_dot_product(matd_t *a,matd_t *b)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x387,"double matd_vec_dot_product(const matd_t *, const matd_t *)");
  }
  if (b == (matd_t *)0x0) {
    __assert_fail("b != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x388,"double matd_vec_dot_product(const matd_t *, const matd_t *)");
  }
  if (((a->ncols == 1) || (a->nrows == 1)) && ((b->ncols == 1 || (b->nrows == 1)))) {
    uVar1 = a->ncols * a->nrows;
    if (uVar1 != b->ncols * b->nrows) {
      __assert_fail("adim == bdim",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                    ,0x38c,"double matd_vec_dot_product(const matd_t *, const matd_t *)");
    }
    if ((int)uVar1 < 1) {
      dVar3 = 0.0;
    }
    else {
      dVar3 = 0.0;
      uVar2 = 0;
      do {
        dVar3 = dVar3 + (double)a[uVar2 + 1] * (double)b[uVar2 + 1];
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    return dVar3;
  }
  __assert_fail("matd_is_vector(a) && matd_is_vector(b)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x389,"double matd_vec_dot_product(const matd_t *, const matd_t *)");
}

Assistant:

double matd_vec_dot_product(const matd_t *a, const matd_t *b)
{
    assert(a != NULL);
    assert(b != NULL);
    assert(matd_is_vector(a) && matd_is_vector(b));
    int adim = a->ncols*a->nrows;
    int bdim = b->ncols*b->nrows;
    assert(adim == bdim);

    double acc = 0;
    for (int i = 0; i < adim; i++) {
        acc += a->data[i] * b->data[i];
    }
    return acc;
}